

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.h
# Opt level: O2

ChFrame<double> * __thiscall
chrono::ChBodyAuxRef::GetFrame_COG_to_REF
          (ChFrame<double> *__return_storage_ptr__,ChBodyAuxRef *this)

{
  ChFrameMoving<double> CStack_108;
  
  ChFrameMoving<double>::GetInverse(&CStack_108,&this->auxref_to_cog);
  ChFrame<double>::ChFrame(__return_storage_ptr__,&CStack_108.super_ChFrame<double>);
  return __return_storage_ptr__;
}

Assistant:

ChFrame<> GetFrame_COG_to_REF() const { return auxref_to_cog.GetInverse(); }